

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O1

void __thiscall
optimization::inlineFunc::Rewriter::Rewriter
          (Rewriter *this,MirFunction *func,MirFunction *subfunc,CallInst *callInst,int cur_blkId)

{
  _Rb_tree_header *p_Var1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *pmVar2;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *this_00;
  char *pcVar3;
  uint32_t uVar4;
  bool bVar5;
  undefined1 uVar6;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  pointer pVVar9;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar10;
  uint32_t *puVar11;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar12;
  _Rb_tree_color *p_Var13;
  key_type_conflict *pkVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  size_type sVar18;
  mapped_type *pmVar19;
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  _Rb_tree_header *p_Var22;
  key_type_conflict kVar23;
  _Self __tmp_2;
  int iVar24;
  variant<int,_mir::inst::VarId> *__v;
  _Rb_tree_color _Var25;
  _Rb_tree_header *p_Var26;
  ulong uVar27;
  bool bVar28;
  int ret;
  uint32_t new_id;
  VarId destId;
  _Rb_tree_color local_cc;
  MirFunction *local_c8;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
  *local_c0;
  key_type_conflict local_b4;
  CallInst *local_b0;
  pair<unsigned_int,_mir::inst::Variable> local_a8;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_80;
  undefined **local_78;
  key_type_conflict local_70 [2];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *local_68;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_60;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_58;
  _Rb_tree_header *local_50;
  undefined **local_48;
  undefined **local_40;
  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
  *local_38;
  
  this->func = func;
  this->subfunc = subfunc;
  p_Var26 = &(this->var_cast_map)._M_t._M_impl.super__Rb_tree_header;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var26->_M_header;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var26->_M_header;
  (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->label_cast_map)._M_t._M_impl.super__Rb_tree_header;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->label_cast_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->init_inst_before).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->init_inst_before).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->init_inst_before).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->init_inst_after).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->init_inst_after).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->init_inst_after).
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cur_blkId = cur_blkId;
  this->Inline_Var_Priority = 0;
  local_c8 = subfunc;
  local_b0 = callInst;
  p_Var7 = (_Rb_tree_node_base *)
           std::_Rb_tree_decrement(&(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  _Var25 = p_Var7[1]._M_color;
  while (1000000 < _Var25) {
    p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var7);
    _Var25 = p_Var7[1]._M_color;
  }
  pmVar2 = &this->var_cast_map;
  local_68 = &this->label_cast_map;
  local_58 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&this->init_inst_before;
  local_60 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)&this->init_inst_after;
  this_00 = &func->variables;
  this->varId = _Var25;
  p_Var7 = (_Rb_tree_node_base *)
           std::_Rb_tree_decrement(&(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header)
  ;
  lVar8 = std::_Rb_tree_decrement(p_Var7);
  this->labelId = *(int *)(lVar8 + 0x20);
  pVVar9 = (local_b0->params).
           super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = p_Var26;
  if ((local_b0->params).super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar9) {
    local_38 = &local_c8->variables;
    lVar8 = 0x18;
    uVar27 = 0;
    local_40 = &PTR_display_001f0018;
    local_48 = &PTR_display_001effc8;
    do {
      uVar27 = uVar27 + 1;
      local_78 = (undefined **)CONCAT44(local_78._4_4_,(int)uVar27);
      pcVar3 = (char *)((long)&(pVVar9->super_Displayable)._vptr_Displayable + lVar8);
      __v = (variant<int,_mir::inst::VarId> *)(pcVar3 + -0x10);
      if (*pcVar3 == '\0') {
        pvVar12 = std::get<0ul,int,mir::inst::VarId>(__v);
        local_80 = (map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)CONCAT44(local_80._4_4_,*pvVar12);
        _Var25 = this->varId + _S_black;
        this->varId = _Var25;
        local_a8.first = (uint)local_78;
        pmVar15 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::at(local_38,&local_a8.first);
        local_cc = _Var25;
        pmVar16 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::operator[](this_00,&local_cc);
        (pmVar16->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pmVar15->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar16->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,
                   &(pmVar15->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        bVar28 = pmVar15->is_temp_var;
        bVar5 = pmVar15->is_phi_var;
        uVar6 = pmVar15->field_0x1b;
        iVar24 = pmVar15->priority;
        pmVar16->is_memory_var = pmVar15->is_memory_var;
        pmVar16->is_temp_var = bVar28;
        pmVar16->is_phi_var = bVar5;
        pmVar16->field_0x1b = uVar6;
        pmVar16->priority = iVar24;
        iVar24 = this->Inline_Var_Priority;
        local_a8.first = _Var25;
        pmVar15 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::operator[](this_00,&local_a8.first);
        pmVar15->priority = iVar24;
        local_a8._0_8_ = operator_new(0x38);
        (((Inst *)local_a8._0_8_)->dest).super_Displayable = (Displayable)&PTR_display_001ee058;
        *(_Rb_tree_color *)((long)&((Inst *)local_a8._0_8_)->dest + 8) = _Var25;
        ((Inst *)local_a8._0_8_)->super_Displayable = (Displayable)local_40;
        *(undefined1 *)&((Inst *)(local_a8._0_8_ + 0x30))->super_Displayable = 0;
        *(undefined4 *)&((VarId *)(local_a8._0_8_ + 0x18 + 8))->super_Displayable = local_80._0_4_;
        ((Inst *)(local_a8._0_8_ + 0x18))->super_Displayable = (Displayable)local_48;
        *(undefined2 *)(local_a8._0_8_ + 0x30 + 1) = 1;
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_58,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            &local_a8);
        if ((Inst *)local_a8._0_8_ != (Inst *)0x0) {
          (**(code **)(*(long *)local_a8._0_8_ + 0x28))();
        }
        p_Var13 = (_Rb_tree_color *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](pmVar2,(key_type *)&local_78);
        *p_Var13 = _Var25;
        p_Var26 = local_50;
      }
      else {
        pvVar10 = std::get<1ul,int,mir::inst::VarId>(__v);
        uVar4 = pvVar10->id;
        puVar11 = (uint32_t *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](pmVar2,(key_type *)&local_78);
        *puVar11 = uVar4;
      }
      pVVar9 = (local_b0->params).
               super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar27 < (ulong)((long)(local_b0->params).
                                    super__Vector_base<mir::inst::Value,_std::allocator<mir::inst::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar9 >> 5))
    ;
  }
  local_cc = _S_red;
  kVar23 = this->varId + 1;
  this->varId = kVar23;
  local_78 = &PTR_display_001ee058;
  local_c0 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
              *)this_00;
  local_70[0] = kVar23;
  pkVar14 = (key_type_conflict *)
            std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
            operator[](pmVar2,(key_type *)&local_cc);
  *pkVar14 = kVar23;
  p_Var1 = &(local_c8->variables)._M_t._M_impl.super__Rb_tree_header;
  p_Var17 = (local_c8->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var20 = &p_Var1->_M_header;
  for (; p_Var17 != (_Base_ptr)0x0; p_Var17 = (&p_Var17->_M_left)[bVar28]) {
    bVar28 = p_Var17[1]._M_color < local_cc;
    if (!bVar28) {
      p_Var20 = p_Var17;
    }
  }
  p_Var17 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var20 != p_Var1) && (p_Var17 = p_Var20, local_cc < p_Var20[1]._M_color))
  {
    p_Var17 = &p_Var1->_M_header;
  }
  local_80 = &local_c8->variables;
  if ((_Rb_tree_header *)p_Var17 == p_Var1) {
    pmVar15 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::at((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                    *)local_c0,&(local_b0->super_Inst).dest.id);
    pmVar16 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)local_c0,local_70);
  }
  else {
    local_a8.first = local_cc;
    pmVar15 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::at(local_80,&local_a8.first);
    pmVar16 = std::
              map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
              ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                            *)local_c0,local_70);
  }
  (pmVar16->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pmVar15->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(pmVar16->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(pmVar15->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar28 = pmVar15->is_temp_var;
  bVar5 = pmVar15->is_phi_var;
  uVar6 = pmVar15->field_0x1b;
  iVar24 = pmVar15->priority;
  pmVar16->is_memory_var = pmVar15->is_memory_var;
  pmVar16->is_temp_var = bVar28;
  pmVar16->is_phi_var = bVar5;
  pmVar16->field_0x1b = uVar6;
  pmVar16->priority = iVar24;
  local_a8._0_8_ = operator_new(0x38);
  uVar4 = (local_b0->super_Inst).dest.id;
  *(undefined ***)(local_a8._0_8_ + 8) = &PTR_display_001ee058;
  *(uint32_t *)(local_a8._0_8_ + 0x10) = uVar4;
  *(undefined ***)local_a8._0_8_ = &PTR_display_001f0018;
  *(undefined1 *)(local_a8._0_8_ + 0x30) = 1;
  *(undefined ***)(local_a8._0_8_ + 0x20) = &PTR_display_001ee058;
  *(key_type_conflict *)(local_a8._0_8_ + 0x28) = local_70[0];
  *(undefined ***)(local_a8._0_8_ + 0x18) = &PTR_display_001effc8;
  *(undefined2 *)(local_a8._0_8_ + 0x31) = 1;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            (local_60,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                      &local_a8);
  if ((_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>)local_a8._0_8_ !=
      (Inst *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 0x28))();
  }
  p_Var17 = (local_c8->variables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var17 != p_Var1) {
    do {
      _Var25 = p_Var17[1]._M_color;
      p_Var20 = (this->var_cast_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var21 = &p_Var26->_M_header;
      for (; (_Rb_tree_header *)p_Var20 != (_Rb_tree_header *)0x0;
          p_Var20 = (&p_Var20->_M_left)[(int)*(size_t *)(p_Var20 + 1) < (int)_Var25]) {
        if ((int)_Var25 <= (int)*(size_t *)(p_Var20 + 1)) {
          p_Var21 = p_Var20;
        }
      }
      p_Var22 = p_Var26;
      if (((_Rb_tree_header *)p_Var21 != p_Var26) &&
         (p_Var22 = (_Rb_tree_header *)p_Var21,
         (int)_Var25 < (int)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
        p_Var22 = p_Var26;
      }
      if (p_Var22 == p_Var26) {
        kVar23 = this->varId + 1;
        this->varId = kVar23;
        local_b4 = kVar23;
        local_a8.first = _Var25;
        pkVar14 = (key_type_conflict *)
                  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](pmVar2,(key_type *)&local_a8);
        *pkVar14 = kVar23;
        pmVar15 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::at(local_80,&p_Var17[1]._M_color);
        local_a8.first = local_b4;
        local_a8.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
        local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (pmVar15->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (pmVar15->ty).super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_a8.second.is_memory_var = pmVar15->is_memory_var;
        local_a8.second.is_temp_var = pmVar15->is_temp_var;
        local_a8.second.is_phi_var = pmVar15->is_phi_var;
        local_a8.second._27_1_ = pmVar15->field_0x1b;
        local_a8.second.priority = pmVar15->priority;
        std::
        _Rb_tree<unsigned_int,std::pair<unsigned_int_const,mir::inst::Variable>,std::_Select1st<std::pair<unsigned_int_const,mir::inst::Variable>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,mir::inst::Variable>>>
        ::_M_emplace_unique<std::pair<unsigned_int,mir::inst::Variable>>(local_c0,&local_a8);
        local_a8.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eff98;
        if (local_a8.second.ty.super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.second.ty.
                     super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi);
        }
        iVar24 = this->Inline_Var_Priority;
        pmVar15 = std::
                  map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                  ::operator[]((map<unsigned_int,_mir::inst::Variable,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_mir::inst::Variable>_>_>
                                *)local_c0,&local_b4);
        pmVar15->priority = iVar24;
        p_Var26 = local_50;
      }
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
    } while ((_Rb_tree_header *)p_Var17 != p_Var1);
  }
  pmVar2 = local_68;
  p_Var26 = &(local_c8->basic_blks)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var7 = (local_c8->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var26;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    iVar24 = this->labelId + 1;
    this->labelId = iVar24;
    sVar18 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                       (pmVar2,(key_type *)(p_Var7 + 1));
    if (sVar18 == 0) {
      pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                operator[](pmVar2,(key_type *)(p_Var7 + 1));
      *pmVar19 = iVar24;
    }
  }
  lVar8 = std::_Rb_tree_decrement(&p_Var26->_M_header);
  pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (pmVar2,(key_type *)
                              ((local_c8->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left + 1));
  this->sub_starttId = *pmVar19;
  pmVar19 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                      (pmVar2,(key_type *)(lVar8 + 0x20));
  this->sub_endId = *pmVar19;
  return;
}

Assistant:

Rewriter(mir::inst::MirFunction& func, mir::inst::MirFunction& subfunc,
           mir::inst::CallInst& callInst, int cur_blkId)
      : func(func), subfunc(subfunc), cur_blkId(cur_blkId) {
    auto var_end_iter = func.variables.end();
    var_end_iter--;
    while (var_end_iter->first > 1000000) {
      var_end_iter--;
    }
    varId = var_end_iter->first;
    auto label_end_iter = func.basic_blks.end();
    label_end_iter--;
    label_end_iter--;
    labelId = label_end_iter->first;
    for (int i = 0; i < callInst.params.size(); i++) {
      int para = i + 1;
      if (callInst.params[i].index() == 0) {
        auto imm = std::get<int>(callInst.params[i]);
        auto destId = get_new_varId();
        func.variables[destId] = subfunc.variables.at(para);
        func.variables[destId].priority = Inline_Var_Priority;
        init_inst_before.push_back(
            std::make_unique<mir::inst::AssignInst>(destId, imm));
        var_cast_map[para] = destId.id;
      } else {
        auto para_varId = std::get<mir::inst::VarId>(callInst.params[i]);
        var_cast_map[para] = para_varId.id;
      }
    }
    int ret = 0;
    auto destId = get_new_varId();
    var_cast_map[ret] = destId.id;
    if (subfunc.variables.count(ret)) {
      func.variables[destId.id] = subfunc.variables.at(ret);
    } else {
      func.variables[destId.id] = func.variables.at(callInst.dest.id);
    }
    init_inst_after.push_back(
        std::make_unique<mir::inst::AssignInst>(callInst.dest, destId));
    for (auto iter = subfunc.variables.begin(); iter != subfunc.variables.end();
         ++iter) {
      if (!var_cast_map.count(iter->first)) {
        auto new_id = get_new_varId().id;
        var_cast_map[iter->first] = new_id;
        func.variables.insert(
            std::make_pair(new_id, subfunc.variables.at(iter->first)));
        func.variables[new_id].priority = Inline_Var_Priority;
      }
    }
    for (auto iter = subfunc.basic_blks.begin();
         iter != subfunc.basic_blks.end(); ++iter) {
      int new_id;

      new_id = get_new_labelId();
      if (!label_cast_map.count(iter->first)) {
        label_cast_map[iter->first] = new_id;
      }
    }
    auto iter = subfunc.basic_blks.end();
    iter--;
    sub_starttId = label_cast_map.at(subfunc.basic_blks.begin()->first);
    sub_endId = label_cast_map.at(iter->first);
  }